

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O3

terminal_output_type __thiscall
E64::blitter_ic::terminal_check_output(blitter_ic *this,uint8_t no,bool top_down,uint32_t *address)

{
  ushort uVar1;
  int iVar2;
  terminal_output_type tVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  uint uVar5;
  
  iVar2 = (int)CONCAT71(in_register_00000031,no);
  uVar4 = (ulong)(uint)(iVar2 * 0x140);
  uVar1 = *(ushort *)(this->blit->command_buffer + (uVar4 - 0x3d));
  if (uVar1 == 0) {
    return NOTHING;
  }
  uVar5 = 0;
  tVar3 = NOTHING;
  do {
    if (this->tile_ram[(uVar5 & 0xffff) + iVar2 * 0x2000 & 0x1fffff] == ':') {
      tVar3 = ASCII;
LAB_00116d31:
      if (top_down) {
        return tVar3;
      }
    }
    else if (this->tile_ram[(uVar5 & 0xffff) + iVar2 * 0x2000 & 0x1fffff] == ';') {
      tVar3 = MONITOR_WORD;
      goto LAB_00116d31;
    }
    uVar5 = uVar5 + (byte)this->blit->command_buffer[uVar4 - 0x41];
    if (uVar1 <= uVar5) {
      return tVar3;
    }
  } while( true );
}

Assistant:

enum E64::terminal_output_type E64::blitter_ic::terminal_check_output(uint8_t no, bool top_down, uint32_t *address)
{
	enum terminal_output_type output = NOTHING;

	for (int i = 0; i < blit[no].get_tiles(); i += blit[no].get_columns()) {
		if (terminal_get_tile(no, i) == ':') {
			output = ASCII;
			char potential_address[7];
			for (int j=0; j<6; j++) {
				potential_address[j] = terminal_get_tile(no, i+1+j);
			}
			potential_address[6] = 0;
			//hud.hex_string_to_int(potential_address, address);
			if (top_down) break;
		} else if (terminal_get_tile(no, i) == ';') {
			output = MONITOR_WORD;
			char potential_address[7];
			for (int j=0; j<6; j++) {
				potential_address[j] = terminal_get_tile(no, i+1+j);
			}
			potential_address[6] = 0;
			//hud.hex_string_to_int(potential_address, address);
			if (top_down) break;
		}
	}
	return output;
}